

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention.cpp
# Opt level: O3

int __thiscall ncnn::MultiHeadAttention::load_model(MultiHeadAttention *this,ModelBin *mb)

{
  int *piVar1;
  void *pvVar2;
  Allocator *pAVar3;
  int iVar4;
  Mat local_70;
  
  (*mb->_vptr_ModelBin[2])(&local_70,mb,(ulong)(uint)this->weight_data_size,0);
  if (&this->q_weight_data != &local_70) {
    if (local_70.refcount != (int *)0x0) {
      LOCK();
      *local_70.refcount = *local_70.refcount + 1;
      UNLOCK();
    }
    piVar1 = (this->q_weight_data).refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        pvVar2 = (this->q_weight_data).data;
        pAVar3 = (this->q_weight_data).allocator;
        if (pAVar3 == (Allocator *)0x0) {
          if (pvVar2 != (void *)0x0) {
            free(pvVar2);
          }
        }
        else {
          (*pAVar3->_vptr_Allocator[3])();
        }
      }
    }
    (this->q_weight_data).data = local_70.data;
    (this->q_weight_data).refcount = local_70.refcount;
    (this->q_weight_data).elemsize = local_70.elemsize;
    (this->q_weight_data).elempack = local_70.elempack;
    (this->q_weight_data).allocator = local_70.allocator;
    (this->q_weight_data).dims = local_70.dims;
    (this->q_weight_data).w = local_70.w;
    (this->q_weight_data).h = local_70.h;
    (this->q_weight_data).d = local_70.d;
    (this->q_weight_data).c = local_70.c;
    (this->q_weight_data).cstep = local_70.cstep;
  }
  if (local_70.refcount != (int *)0x0) {
    LOCK();
    *local_70.refcount = *local_70.refcount + -1;
    UNLOCK();
    if (*local_70.refcount == 0) {
      if (local_70.allocator == (Allocator *)0x0) {
        if (local_70.data != (void *)0x0) {
          free(local_70.data);
        }
      }
      else {
        (*(local_70.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  iVar4 = -100;
  if (((this->q_weight_data).data != (void *)0x0) &&
     ((long)(this->q_weight_data).c * (this->q_weight_data).cstep != 0)) {
    (*mb->_vptr_ModelBin[2])(&local_70,mb,(ulong)(uint)this->embed_dim,1);
    if (&this->q_bias_data != &local_70) {
      if (local_70.refcount != (int *)0x0) {
        LOCK();
        *local_70.refcount = *local_70.refcount + 1;
        UNLOCK();
      }
      piVar1 = (this->q_bias_data).refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          pvVar2 = (this->q_bias_data).data;
          pAVar3 = (this->q_bias_data).allocator;
          if (pAVar3 == (Allocator *)0x0) {
            if (pvVar2 != (void *)0x0) {
              free(pvVar2);
            }
          }
          else {
            (*pAVar3->_vptr_Allocator[3])();
          }
        }
      }
      (this->q_bias_data).data = local_70.data;
      (this->q_bias_data).refcount = local_70.refcount;
      (this->q_bias_data).elemsize = local_70.elemsize;
      (this->q_bias_data).elempack = local_70.elempack;
      (this->q_bias_data).allocator = local_70.allocator;
      (this->q_bias_data).dims = local_70.dims;
      (this->q_bias_data).w = local_70.w;
      (this->q_bias_data).h = local_70.h;
      (this->q_bias_data).d = local_70.d;
      (this->q_bias_data).c = local_70.c;
      (this->q_bias_data).cstep = local_70.cstep;
    }
    if (local_70.refcount != (int *)0x0) {
      LOCK();
      *local_70.refcount = *local_70.refcount + -1;
      UNLOCK();
      if (*local_70.refcount == 0) {
        if (local_70.allocator == (Allocator *)0x0) {
          if (local_70.data != (void *)0x0) {
            free(local_70.data);
          }
        }
        else {
          (*(local_70.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if (((this->q_bias_data).data != (void *)0x0) &&
       ((long)(this->q_bias_data).c * (this->q_bias_data).cstep != 0)) {
      (*mb->_vptr_ModelBin[2])(&local_70,mb,(ulong)(uint)this->weight_data_size,0);
      if (&this->k_weight_data != &local_70) {
        if (local_70.refcount != (int *)0x0) {
          LOCK();
          *local_70.refcount = *local_70.refcount + 1;
          UNLOCK();
        }
        piVar1 = (this->k_weight_data).refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            pvVar2 = (this->k_weight_data).data;
            pAVar3 = (this->k_weight_data).allocator;
            if (pAVar3 == (Allocator *)0x0) {
              if (pvVar2 != (void *)0x0) {
                free(pvVar2);
              }
            }
            else {
              (*pAVar3->_vptr_Allocator[3])();
            }
          }
        }
        (this->k_weight_data).data = local_70.data;
        (this->k_weight_data).refcount = local_70.refcount;
        (this->k_weight_data).elemsize = local_70.elemsize;
        (this->k_weight_data).elempack = local_70.elempack;
        (this->k_weight_data).allocator = local_70.allocator;
        (this->k_weight_data).dims = local_70.dims;
        (this->k_weight_data).w = local_70.w;
        (this->k_weight_data).h = local_70.h;
        (this->k_weight_data).d = local_70.d;
        (this->k_weight_data).c = local_70.c;
        (this->k_weight_data).cstep = local_70.cstep;
      }
      if (local_70.refcount != (int *)0x0) {
        LOCK();
        *local_70.refcount = *local_70.refcount + -1;
        UNLOCK();
        if (*local_70.refcount == 0) {
          if (local_70.allocator == (Allocator *)0x0) {
            if (local_70.data != (void *)0x0) {
              free(local_70.data);
            }
          }
          else {
            (*(local_70.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (((this->k_weight_data).data != (void *)0x0) &&
         ((long)(this->k_weight_data).c * (this->k_weight_data).cstep != 0)) {
        (*mb->_vptr_ModelBin[2])(&local_70,mb,(ulong)(uint)this->embed_dim,1);
        if (&this->k_bias_data != &local_70) {
          if (local_70.refcount != (int *)0x0) {
            LOCK();
            *local_70.refcount = *local_70.refcount + 1;
            UNLOCK();
          }
          piVar1 = (this->k_bias_data).refcount;
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              pvVar2 = (this->k_bias_data).data;
              pAVar3 = (this->k_bias_data).allocator;
              if (pAVar3 == (Allocator *)0x0) {
                if (pvVar2 != (void *)0x0) {
                  free(pvVar2);
                }
              }
              else {
                (*pAVar3->_vptr_Allocator[3])();
              }
            }
          }
          (this->k_bias_data).data = local_70.data;
          (this->k_bias_data).refcount = local_70.refcount;
          (this->k_bias_data).elemsize = local_70.elemsize;
          (this->k_bias_data).elempack = local_70.elempack;
          (this->k_bias_data).allocator = local_70.allocator;
          (this->k_bias_data).dims = local_70.dims;
          (this->k_bias_data).w = local_70.w;
          (this->k_bias_data).h = local_70.h;
          (this->k_bias_data).d = local_70.d;
          (this->k_bias_data).c = local_70.c;
          (this->k_bias_data).cstep = local_70.cstep;
        }
        if (local_70.refcount != (int *)0x0) {
          LOCK();
          *local_70.refcount = *local_70.refcount + -1;
          UNLOCK();
          if (*local_70.refcount == 0) {
            if (local_70.allocator == (Allocator *)0x0) {
              if (local_70.data != (void *)0x0) {
                free(local_70.data);
              }
            }
            else {
              (*(local_70.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        if (((this->k_bias_data).data != (void *)0x0) &&
           ((long)(this->k_bias_data).c * (this->k_bias_data).cstep != 0)) {
          (*mb->_vptr_ModelBin[2])(&local_70,mb,(ulong)(uint)this->weight_data_size,0);
          if (&this->v_weight_data != &local_70) {
            if (local_70.refcount != (int *)0x0) {
              LOCK();
              *local_70.refcount = *local_70.refcount + 1;
              UNLOCK();
            }
            piVar1 = (this->v_weight_data).refcount;
            if (piVar1 != (int *)0x0) {
              LOCK();
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (*piVar1 == 0) {
                pvVar2 = (this->v_weight_data).data;
                pAVar3 = (this->v_weight_data).allocator;
                if (pAVar3 == (Allocator *)0x0) {
                  if (pvVar2 != (void *)0x0) {
                    free(pvVar2);
                  }
                }
                else {
                  (*pAVar3->_vptr_Allocator[3])();
                }
              }
            }
            (this->v_weight_data).data = local_70.data;
            (this->v_weight_data).refcount = local_70.refcount;
            (this->v_weight_data).elemsize = local_70.elemsize;
            (this->v_weight_data).elempack = local_70.elempack;
            (this->v_weight_data).allocator = local_70.allocator;
            (this->v_weight_data).dims = local_70.dims;
            (this->v_weight_data).w = local_70.w;
            (this->v_weight_data).h = local_70.h;
            (this->v_weight_data).d = local_70.d;
            (this->v_weight_data).c = local_70.c;
            (this->v_weight_data).cstep = local_70.cstep;
          }
          if (local_70.refcount != (int *)0x0) {
            LOCK();
            *local_70.refcount = *local_70.refcount + -1;
            UNLOCK();
            if (*local_70.refcount == 0) {
              if (local_70.allocator == (Allocator *)0x0) {
                if (local_70.data != (void *)0x0) {
                  free(local_70.data);
                }
              }
              else {
                (*(local_70.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          if (((this->v_weight_data).data != (void *)0x0) &&
             ((long)(this->v_weight_data).c * (this->v_weight_data).cstep != 0)) {
            (*mb->_vptr_ModelBin[2])(&local_70,mb,(ulong)(uint)this->embed_dim,1);
            if (&this->v_bias_data != &local_70) {
              if (local_70.refcount != (int *)0x0) {
                LOCK();
                *local_70.refcount = *local_70.refcount + 1;
                UNLOCK();
              }
              piVar1 = (this->v_bias_data).refcount;
              if (piVar1 != (int *)0x0) {
                LOCK();
                *piVar1 = *piVar1 + -1;
                UNLOCK();
                if (*piVar1 == 0) {
                  pvVar2 = (this->v_bias_data).data;
                  pAVar3 = (this->v_bias_data).allocator;
                  if (pAVar3 == (Allocator *)0x0) {
                    if (pvVar2 != (void *)0x0) {
                      free(pvVar2);
                    }
                  }
                  else {
                    (*pAVar3->_vptr_Allocator[3])();
                  }
                }
              }
              (this->v_bias_data).data = local_70.data;
              (this->v_bias_data).refcount = local_70.refcount;
              (this->v_bias_data).elemsize = local_70.elemsize;
              (this->v_bias_data).elempack = local_70.elempack;
              (this->v_bias_data).allocator = local_70.allocator;
              (this->v_bias_data).dims = local_70.dims;
              (this->v_bias_data).w = local_70.w;
              (this->v_bias_data).h = local_70.h;
              (this->v_bias_data).d = local_70.d;
              (this->v_bias_data).c = local_70.c;
              (this->v_bias_data).cstep = local_70.cstep;
            }
            if (local_70.refcount != (int *)0x0) {
              LOCK();
              *local_70.refcount = *local_70.refcount + -1;
              UNLOCK();
              if (*local_70.refcount == 0) {
                if (local_70.allocator == (Allocator *)0x0) {
                  if (local_70.data != (void *)0x0) {
                    free(local_70.data);
                  }
                }
                else {
                  (*(local_70.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            if (((this->v_bias_data).data != (void *)0x0) &&
               ((long)(this->v_bias_data).c * (this->v_bias_data).cstep != 0)) {
              (*mb->_vptr_ModelBin[2])(&local_70,mb,(ulong)(uint)this->weight_data_size,0);
              Mat::operator=(&this->out_weight_data,&local_70);
              Mat::~Mat(&local_70);
              if (((this->out_weight_data).data != (void *)0x0) &&
                 ((long)(this->out_weight_data).c * (this->out_weight_data).cstep != 0)) {
                (*mb->_vptr_ModelBin[2])(&local_70,mb,(ulong)(uint)this->embed_dim,1);
                Mat::operator=(&this->out_bias_data,&local_70);
                Mat::~Mat(&local_70);
                if (((this->out_bias_data).data == (void *)0x0) ||
                   (iVar4 = 0, (long)(this->out_bias_data).c * (this->out_bias_data).cstep == 0)) {
                  iVar4 = -100;
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int MultiHeadAttention::load_model(const ModelBin& mb)
{
    q_weight_data = mb.load(weight_data_size, 0);
    if (q_weight_data.empty())
        return -100;

    q_bias_data = mb.load(embed_dim, 1);
    if (q_bias_data.empty())
        return -100;

    k_weight_data = mb.load(weight_data_size, 0);
    if (k_weight_data.empty())
        return -100;

    k_bias_data = mb.load(embed_dim, 1);
    if (k_bias_data.empty())
        return -100;

    v_weight_data = mb.load(weight_data_size, 0);
    if (v_weight_data.empty())
        return -100;

    v_bias_data = mb.load(embed_dim, 1);
    if (v_bias_data.empty())
        return -100;

    out_weight_data = mb.load(weight_data_size, 0);
    if (out_weight_data.empty())
        return -100;

    out_bias_data = mb.load(embed_dim, 1);
    if (out_bias_data.empty())
        return -100;

    return 0;
}